

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeXYZROTnodeBushingSpherical::ChLoadXYZROTnodeXYZROTnodeBushingSpherical
          (ChLoadXYZROTnodeXYZROTnodeBushingSpherical *this,
          ChLoadXYZROTnodeXYZROTnodeBushingSpherical *param_1)

{
  ChLoadXYZROTnodeXYZROTnode::ChLoadXYZROTnodeXYZROTnode
            (&this->super_ChLoadXYZROTnodeXYZROTnode,&param_1->super_ChLoadXYZROTnodeXYZROTnode);
  (this->super_ChLoadXYZROTnodeXYZROTnode).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeXYZROTnode_01176f48;
  (this->stiffness).m_data[0] = (param_1->stiffness).m_data[0];
  (this->stiffness).m_data[1] = (param_1->stiffness).m_data[1];
  (this->stiffness).m_data[2] = (param_1->stiffness).m_data[2];
  (this->damping).m_data[0] = (param_1->damping).m_data[0];
  (this->damping).m_data[1] = (param_1->damping).m_data[1];
  (this->damping).m_data[2] = (param_1->damping).m_data[2];
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeXYZROTnodeBushingSpherical : public ChLoadXYZROTnodeXYZROTnode {
  public:
    ChLoadXYZROTnodeXYZROTnodeBushingSpherical(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChNodeFEAxyzrot> mnodeB,  ///< node B
        const ChFrame<>&
            abs_application,  ///< create bushing here, in abs. coordinates. Will define loc_application_A and B
        const ChVector<>& mstiffness,  ///< stiffness, along x y z axes of the abs_application
        const ChVector<>& mdamping     ///< damping, along x y z axes of the abs_application
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZROTnodeXYZROTnodeBushingSpherical* Clone() const override {
        return new ChLoadXYZROTnodeXYZROTnodeBushingSpherical(*this);
    }

    /// Set stiffness, along the x y z axes of frame of loc_application_B, es [N/m]
    void SetStiffness(const ChVector<> mstiffness) { stiffness = mstiffness; }
    ChVector<> GetStiffness() const { return stiffness; }

    /// Set damping, along the x y z axes of frame of loc_application_B, es [Ns/m]
    void SetDamping(const ChVector<> mdamping) { damping = mdamping; }
    ChVector<> GetDamping() const { return damping; }

  protected:
    ChVector<> stiffness;
    ChVector<> damping;

    virtual bool IsStiff() override { return true; }

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;
}